

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subflow.cc
# Opt level: O0

bool __thiscall SubfloatFlow::createLink(SubfloatFlow *this,ReplaceOp *rop,int4 slot,Varnode *vn)

{
  ReplaceVarnode *pRVar1;
  size_type sVar2;
  reference ppRVar3;
  value_type local_48;
  ReplaceVarnode *local_40;
  ReplaceVarnode *rep;
  Varnode *pVStack_30;
  bool inworklist;
  Varnode *vn_local;
  ReplaceOp *pRStack_20;
  int4 slot_local;
  ReplaceOp *rop_local;
  SubfloatFlow *this_local;
  
  pVStack_30 = vn;
  vn_local._4_4_ = slot;
  pRStack_20 = rop;
  rop_local = (ReplaceOp *)this;
  local_40 = setReplacement(this,vn,(bool *)((long)&rep + 7));
  if (local_40 == (ReplaceVarnode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (pRStack_20 != (ReplaceOp *)0x0) {
      if (vn_local._4_4_ == -1) {
        pRStack_20->output = local_40;
        local_40->def = pRStack_20;
      }
      else {
        while (sVar2 = std::
                       vector<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                       ::size(&pRStack_20->input), pRVar1 = local_40,
              sVar2 <= (ulong)(long)vn_local._4_4_) {
          local_48 = (value_type)0x0;
          std::
          vector<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>::
          push_back(&pRStack_20->input,&local_48);
        }
        ppRVar3 = std::
                  vector<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                  ::operator[](&pRStack_20->input,(long)vn_local._4_4_);
        *ppRVar3 = pRVar1;
      }
    }
    if ((rep._7_1_ & 1) != 0) {
      std::vector<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>::
      push_back(&this->worklist,&local_40);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SubfloatFlow::createLink(ReplaceOp *rop,int4 slot,Varnode *vn)

{ // Add a new varnode (and the edge which traced to it) to the worklist
  bool inworklist;
  ReplaceVarnode *rep = setReplacement(vn,inworklist);
  if (rep == (ReplaceVarnode *)0) return false;

  if (rop != (ReplaceOp *)0) {
    if (slot == -1) {
      rop->output = rep;
      rep->def = rop;
    }
    else {
      while(rop->input.size() <= slot)
	rop->input.push_back((ReplaceVarnode *)0);
      rop->input[slot] = rep;
    }
  }

  if (inworklist)
    worklist.push_back(rep);
  return true;
}